

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution_test.cpp
# Opt level: O2

void flatbuffers::tests::UnionDeprecationTest(string *tests_data_path)

{
  bool bVar1;
  long lVar2;
  uint8_t *__first;
  StructDef *pSVar3;
  FieldDef *pFVar4;
  undefined1 *puVar5;
  int t;
  string *buf;
  string *buf_00;
  ulong __n;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  string schema;
  string json;
  string local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaries [2];
  string local_b68;
  string jsonfiles [2];
  string schemas [2];
  IDLOptions idl_opts;
  Parser parser;
  
  lVar2 = 0x10;
  do {
    puVar5 = (undefined1 *)((long)&schemas[0]._M_dataplus._M_p + lVar2);
    *(undefined1 **)((long)&jsonfiles[1].field_2 + lVar2) = puVar5;
    *(undefined8 *)((long)&jsonfiles[1].field_2 + lVar2 + 8) = 0;
    *puVar5 = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x50);
  lVar2 = 0x10;
  do {
    puVar5 = (undefined1 *)((long)&jsonfiles[0]._M_dataplus._M_p + lVar2);
    *(undefined1 **)((long)jsonfiles + lVar2 + -0x10) = puVar5;
    *(undefined8 *)((long)jsonfiles + lVar2 + -8) = 0;
    *puVar5 = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x50);
  binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  IDLOptions::IDLOptions(&idl_opts);
  idl_opts.lang_to_generate._1_1_ = idl_opts.lang_to_generate._1_1_ | 1;
  Parser::Parser(&parser,&idl_opts);
  __result.container = binaries;
  t = 1;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x20) {
    std::operator+(&local_bb8,tests_data_path,"evolution_test/evolution_v");
    NumToString<int>(&local_bd8,t);
    std::operator+(&json,&local_bb8,&local_bd8);
    std::operator+(&schema,&json,".fbs");
    std::__cxx11::string::~string((string *)&json);
    std::__cxx11::string::~string((string *)&local_bd8);
    std::__cxx11::string::~string((string *)&local_bb8);
    buf = (string *)((long)&schemas[0]._M_dataplus._M_p + lVar2);
    bVar1 = LoadFile(schema._M_dataplus._M_p,false,buf);
    TestEq<bool,bool>(true,bVar1,
                      "\'true\' != \'flatbuffers::LoadFile(schema.c_str(), false, &schemas[i])\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xa8,"");
    std::operator+(&local_bd8,tests_data_path,"evolution_test/evolution_v");
    NumToString<int>(&local_b68,t);
    std::operator+(&local_bb8,&local_bd8,&local_b68);
    std::operator+(&json,&local_bb8,".json");
    std::__cxx11::string::~string((string *)&local_bb8);
    std::__cxx11::string::~string((string *)&local_b68);
    std::__cxx11::string::~string((string *)&local_bd8);
    buf_00 = (string *)((long)&jsonfiles[0]._M_dataplus._M_p + lVar2);
    bVar1 = LoadFile(json._M_dataplus._M_p,false,buf_00);
    TestEq<bool,bool>(true,bVar1,
                      "\'true\' != \'flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i])\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xab,"");
    bVar1 = Parser::Parse(&parser,(buf->_M_dataplus)._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'parser.Parse(schemas[i].c_str())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xad,"");
    bVar1 = Parser::Parse(&parser,(buf_00->_M_dataplus)._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'parser.Parse(jsonfiles[i].c_str())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xae,"");
    __n = (ulong)parser.builder_.buf_.size_;
    __first = FlatBufferBuilderImpl<false>::GetBufferPointer(&parser.builder_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(__result.container,__n);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (__first,__first + __n,__result);
    std::__cxx11::string::~string((string *)&json);
    std::__cxx11::string::~string((string *)&schema);
    __result.container = __result.container + 1;
    t = t + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&schema,"Evolution.V2.Root",(allocator<char> *)&json);
  pSVar3 = Parser::LookupStruct(&parser,&schema);
  std::__cxx11::string::~string((string *)&schema);
  TestEq<bool,bool>(true,pSVar3 != (StructDef *)0x0,"\'nullptr\' == \'v2\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                    ,0xb7,"");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&schema,"j_type",(allocator<char> *)&json);
  pFVar4 = SymbolTable<flatbuffers::FieldDef>::Lookup(&pSVar3->fields,&schema);
  std::__cxx11::string::~string((string *)&schema);
  TestEq<bool,bool>(true,pFVar4 != (FieldDef *)0x0,"\'nullptr\' == \'j_type_field\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                    ,0xb9,"");
  TestEq<bool,bool>(true,pFVar4->deprecated,"\'true\' != \'j_type_field->deprecated\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                    ,0xba,"");
  Parser::~Parser(&parser);
  IDLOptions::~IDLOptions(&idl_opts);
  lVar2 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&binaries[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&jsonfiles[0]._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&schemas[0]._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return;
}

Assistant:

void UnionDeprecationTest(const std::string &tests_data_path) {
  const int NUM_VERSIONS = 2;
  std::string schemas[NUM_VERSIONS];
  std::string jsonfiles[NUM_VERSIONS];
  std::vector<uint8_t> binaries[NUM_VERSIONS];

  flatbuffers::IDLOptions idl_opts;
  idl_opts.lang_to_generate |= flatbuffers::IDLOptions::kBinary;
  flatbuffers::Parser parser(idl_opts);

  // Load all the schema versions and their associated data.
  for (int i = 0; i < NUM_VERSIONS; ++i) {
    std::string schema = tests_data_path + "evolution_test/evolution_v" +
                         flatbuffers::NumToString(i + 1) + ".fbs";
    TEST_ASSERT(flatbuffers::LoadFile(schema.c_str(), false, &schemas[i]));
    std::string json = tests_data_path + "evolution_test/evolution_v" +
                       flatbuffers::NumToString(i + 1) + ".json";
    TEST_ASSERT(flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i]));

    TEST_ASSERT(parser.Parse(schemas[i].c_str()));
    TEST_ASSERT(parser.Parse(jsonfiles[i].c_str()));

    auto bufLen = parser.builder_.GetSize();
    auto buf = parser.builder_.GetBufferPointer();
    binaries[i].reserve(bufLen);
    std::copy(buf, buf + bufLen, std::back_inserter(binaries[i]));
  }

  auto v2 = parser.LookupStruct("Evolution.V2.Root");
  TEST_NOTNULL(v2);
  auto j_type_field = v2->fields.Lookup("j_type");
  TEST_NOTNULL(j_type_field);
  TEST_ASSERT(j_type_field->deprecated);
}